

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_public(mbedtls_rsa_context *ctx,uchar *input,uchar *output)

{
  size_t buflen;
  int iVar1;
  int iVar2;
  mbedtls_mpi T;
  mbedtls_mpi local_40;
  
  iVar1 = rsa_check_context(ctx,0,(int)output);
  iVar2 = -0x4080;
  if (iVar1 == 0) {
    mbedtls_mpi_init(&local_40);
    iVar2 = mbedtls_mpi_read_binary(&local_40,input,ctx->len);
    if (iVar2 == 0) {
      iVar1 = mbedtls_mpi_cmp_mpi(&local_40,&ctx->N);
      iVar2 = -4;
      if (iVar1 < 0) {
        buflen = ctx->len;
        iVar2 = mbedtls_mpi_exp_mod(&local_40,&local_40,&ctx->E,&ctx->N,&ctx->RN);
        if (iVar2 == 0) {
          iVar1 = mbedtls_mpi_write_binary(&local_40,output,buflen);
          mbedtls_mpi_free(&local_40);
          if (iVar1 != 0) {
            return iVar1 + -0x4280;
          }
          return 0;
        }
      }
    }
    mbedtls_mpi_free(&local_40);
    iVar2 = iVar2 + -0x4280;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_public( mbedtls_rsa_context *ctx,
                const unsigned char *input,
                unsigned char *output )
{
    int ret;
    size_t olen;
    mbedtls_mpi T;

    if( rsa_check_context( ctx, 0 /* public */, 0 /* no blinding */ ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );

    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, &ctx->E, &ctx->N, &ctx->RN ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &T );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PUBLIC_FAILED + ret );

    return( 0 );
}